

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O0

shared_ptr<cppnet::BlockMemoryPool>
cppnet::MakeBlockMemoryPoolPtr(uint32_t large_sz,uint32_t add_num)

{
  undefined4 in_register_0000003c;
  shared_ptr<cppnet::BlockMemoryPool> sVar1;
  shared_ptr<cppnet::BlockMemoryPool> sVar2;
  uint32_t local_14;
  uint32_t add_num_local;
  uint32_t large_sz_local;
  
  sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_register_0000003c;
  sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       large_sz;
  _add_num_local = CONCAT44(in_register_0000003c,large_sz);
  local_14 = add_num;
  sVar1 = std::make_shared<cppnet::BlockMemoryPool,unsigned_int&,unsigned_int&>
                    ((uint *)CONCAT44(in_register_0000003c,large_sz),&local_14);
  sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  return (shared_ptr<cppnet::BlockMemoryPool>)
         sVar2.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockMemoryPool> MakeBlockMemoryPoolPtr(uint32_t large_sz, uint32_t add_num) {
    return std::make_shared<BlockMemoryPool>(large_sz, add_num);
}